

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

bool __thiscall ObjectBlockPool<512,_128>::IsBasePointer(ObjectBlockPool<512,_128> *this,void *ptr)

{
  MyLargeBlock *pMVar1;
  LargeBlock<512,_128> **ppLVar2;
  
  ppLVar2 = &this->activePages;
  do {
    pMVar1 = *ppLVar2;
    if (pMVar1 == (MyLargeBlock *)0x0) break;
    ppLVar2 = &pMVar1->next;
  } while ((ppLVar2 < ptr || ptr < pMVar1->page) || (((int)ptr - (int)pMVar1->page & 0x1ffU) != 8));
  return pMVar1 != (MyLargeBlock *)0x0;
}

Assistant:

bool IsBasePointer(void* ptr)
	{
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			if((char*)ptr >= (char*)curr->page && (char*)ptr <= (char*)curr->page + sizeof(curr->page))
			{
				if(((unsigned int)(intptr_t)((char*)ptr - (char*)curr->page) & (elemSize - 1)) == sizeof(markerType))
					return true;
			}
			curr = curr->next;
		}
		return false;
	}